

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O2

optional<metaf::VisibilityGroup> *
metaf::VisibilityGroup::parse
          (optional<metaf::VisibilityGroup> *__return_storage_ptr__,string *group,
          ReportPart reportPart,ReportMetadata *reportMetadata)

{
  bool bVar1;
  optional<metaf::Distance> v;
  _Storage<metaf::Distance,_true> local_38;
  char local_28;
  
  if (reportPart == RMK) {
    bVar1 = std::operator==(group,"VIS");
    if (bVar1) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload = 0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xc) = 0
      ;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x10) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x1c) =
           0;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x20) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x30) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x3c) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x48) =
           0;
      *(undefined1 *)
       ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
               _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x54) =
           0;
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.incompleteText = VIS;
      goto LAB_0018e650;
    }
    bVar1 = std::operator==(group,"SFC");
    if (bVar1) {
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload = 5;
    }
    else {
      bVar1 = std::operator==(group,"TWR");
      if (!bVar1) {
        bVar1 = std::operator==(group,"RVRNO");
        if (!bVar1) {
          bVar1 = std::operator==(group,"VISNO");
          if (bVar1) {
            *(undefined8 *)
             &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
              _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload = 0x10;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xc) = 0;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x10) = 0;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x1c) = 0;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x20) = 0;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x30) = 0;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x3c) = 0;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x48) = 0;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x54) = 0;
            (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
            _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.
            incompleteText = VISNO;
          }
          else {
            bVar1 = std::operator==(group,"RVR");
            if (!bVar1) goto LAB_0018e701;
            *(undefined8 *)
             &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
              _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload = 0xe;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xc) = 0;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x10) = 0;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x1c) = 0;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x20) = 0;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x30) = 0;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x3c) = 0;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x48) = 0;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x54) = 0;
            (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
            _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.
            incompleteText = RVR;
          }
          goto LAB_0018e650;
        }
        *(undefined8 *)
         &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
          _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload = 0xf;
        *(undefined1 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xc) =
             0;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
                 _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x10)
             = 0;
        goto LAB_0018e638;
      }
      *(undefined8 *)
       &(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload = 6;
    }
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xc) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x10) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x1c) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x20) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x30) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x3c) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x48) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x54) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.incompleteText =
         SFC_OR_TWR;
  }
  else {
    if ((reportPart & ~HEADER) != METAR) {
LAB_0018e701:
      (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
      super__Optional_payload_base<metaf::VisibilityGroup>._M_engaged = false;
      return __return_storage_ptr__;
    }
    fromIncompleteInteger(__return_storage_ptr__,group);
    if ((__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_engaged != false) {
      return __return_storage_ptr__;
    }
    fromMeters(__return_storage_ptr__,group);
    if ((__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
        _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_engaged != false) {
      return __return_storage_ptr__;
    }
    Distance::fromMileString((optional<metaf::Distance> *)&local_38._M_value,group,false);
    if (local_28 == '\0') {
      if ((reportPart == METAR) &&
         (fromRvr(__return_storage_ptr__,group),
         (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
         _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_engaged != false)) {
        return __return_storage_ptr__;
      }
      goto LAB_0018e701;
    }
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xf) =
         local_38._11_1_;
    *(undefined2 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xd) =
         local_38._9_2_;
    (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.visType = PREVAILING;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 4) =
         local_38._0_8_;
    *(bool *)((long)&(__return_storage_ptr__->
                     super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
                     super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0xc) =
         local_38._M_value.dist.super__Optional_base<unsigned_int,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_int>._M_engaged;
    (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.vis.distUnit =
         local_38._M_value.distUnit;
    (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.visMax.distModifier =
         NONE;
LAB_0018e638:
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x1c) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x20) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x30) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x3c) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x48) = 0;
    *(undefined1 *)
     ((long)&(__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>).
             _M_payload.super__Optional_payload_base<metaf::VisibilityGroup>._M_payload + 0x54) = 0;
    (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
    super__Optional_payload_base<metaf::VisibilityGroup>._M_payload._M_value.incompleteText = NONE;
  }
LAB_0018e650:
  (__return_storage_ptr__->super__Optional_base<metaf::VisibilityGroup,_true,_true>)._M_payload.
  super__Optional_payload_base<metaf::VisibilityGroup>._M_engaged = true;
  return __return_storage_ptr__;
}

Assistant:

std::optional<VisibilityGroup> VisibilityGroup::parse(const std::string & group,
	ReportPart reportPart,
	const ReportMetadata & reportMetadata)
{
	(void)reportMetadata;
	if (reportPart == ReportPart::RMK) {
		if (group == "VIS") 
			return VisibilityGroup(Type::PREVAILING, IncompleteText::VIS);
		if (group == "SFC")
			return VisibilityGroup(Type::SURFACE, IncompleteText::SFC_OR_TWR);
		if (group == "TWR")
			return VisibilityGroup(Type::TOWER, IncompleteText::SFC_OR_TWR);
		if (group == "RVRNO") 
			return VisibilityGroup(Type::RVRNO, IncompleteText::NONE);
		if (group == "VISNO") 
			return VisibilityGroup(Type::VISNO, IncompleteText::VISNO);
		if (group == "RVR") 
			return VisibilityGroup(Type::RVR_MISG, IncompleteText::RVR);
	}
	if (reportPart == ReportPart::METAR || reportPart == ReportPart::TAF) {
		if (const auto v = fromIncompleteInteger(group); v.has_value()) return v;
		if (const auto v = fromMeters(group); v.has_value()) return v;
		if (const auto v = Distance::fromMileString(group); v.has_value()) {
			VisibilityGroup result;
			result.vis = *v;
			return result;
		}
	}
	if (reportPart == ReportPart::METAR) {
		if (const auto v = fromRvr(group); v.has_value()) return v;
	}
	return std::optional<VisibilityGroup>();
}